

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O1

char * fs_stdio_get_current_directory(void)

{
  char *pcVar1;
  size_t sVar2;
  int *piVar3;
  int errnum;
  char tmpdir [4096];
  char acStack_1008 [4096];
  
  pcVar1 = getcwd(acStack_1008,0x1000);
  if (pcVar1 == (char *)0x0) {
    piVar3 = __errno_location();
    errnum = *piVar3;
  }
  else {
    sVar2 = strlen(acStack_1008);
    pcVar1 = (char *)al_malloc_with_context
                               (sVar2 + 1,0x223,
                                "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
                                ,"fs_stdio_get_current_directory");
    if (pcVar1 != (char *)0x0) {
      strcpy(pcVar1,acStack_1008);
      return pcVar1;
    }
    errnum = 0xc;
  }
  al_set_errno(errnum);
  return (char *)0x0;
}

Assistant:

static char *fs_stdio_get_current_directory(void)
{
#ifdef ALLEGRO_WINDOWS
   wchar_t *wcwd;
   char *cwd;
   
   wcwd = _wgetcwd(NULL, 1);
   if (!wcwd) {
      al_set_errno(errno);
      return NULL;
   }
   cwd = _al_win_utf16_to_utf8(wcwd);
   free(wcwd);
   return cwd;
#else
   char tmpdir[PATH_MAX];
   char *cwd;

   if (!getcwd(tmpdir, PATH_MAX)) {
      al_set_errno(errno);
      return NULL;
   }

   cwd = al_malloc(strlen(tmpdir) + 1);
   if (!cwd) {
      al_set_errno(ENOMEM);
      return NULL;
   }
   return strcpy(cwd, tmpdir);
#endif
}